

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

void Aig_ManStop(Aig_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int i;
  int iVar3;
  Aig_Man_t *pAVar4;
  
  pAVar4 = p;
  if (p->time1 != 0) {
    Abc_Print((int)p,"%s =","time1");
    Abc_Print((int)pAVar4,"%9.2f sec\n",(double)p->time1 / 1000000.0);
  }
  iVar3 = (int)pAVar4;
  if (p->time2 != 0) {
    Abc_Print(iVar3,"%s =","time2");
    Abc_Print(iVar3,"%9.2f sec\n",(double)p->time2 / 1000000.0);
  }
  iVar3 = 0;
  while( true ) {
    pVVar1 = p->vObjs;
    if (pVVar1->nSize <= iVar3) {
      Tim_ManStopP((Tim_Man_t **)&p->pManTime);
      if (p->pFanData != (int *)0x0) {
        Aig_ManFanoutStop(p);
      }
      if (p->pManExdc != (Aig_Man_t *)0x0) {
        Aig_ManStop(p->pManExdc);
      }
      iVar3 = 0;
      Aig_MmFixedStop(p->pMemObjs,0);
      Vec_PtrFreeP(&p->vCis);
      Vec_PtrFreeP(&p->vCos);
      Vec_PtrFreeP(&p->vObjs);
      Vec_PtrFreeP(&p->vBufs);
      Vec_PtrFreeP(&p->unfold2_type_I);
      Vec_PtrFreeP(&p->unfold2_type_II);
      Vec_IntFreeP(&p->vLevelR);
      Vec_VecFreeP(&p->vLevels);
      Vec_IntFreeP(&p->vFlopNums);
      Vec_IntFreeP(&p->vFlopReprs);
      Vec_VecFreeP((Vec_Vec_t **)&p->vOnehots);
      Vec_VecFreeP(&p->vClockDoms);
      Vec_IntFreeP(&p->vProbs);
      Vec_IntFreeP(&p->vCiNumsOrig);
      Vec_PtrFreeP(&p->vMapped);
      pVVar1 = p->vSeqModelVec;
      if (pVVar1 != (Vec_Ptr_t *)0x0) {
        for (; iVar3 < pVVar1->nSize; iVar3 = iVar3 + 1) {
          pvVar2 = Vec_PtrEntry(pVVar1,iVar3);
          if ((void *)0x2 < pvVar2) {
            free(pvVar2);
          }
        }
        Vec_PtrFree(pVVar1);
      }
      if (p->pTerSimData != (uint *)0x0) {
        free(p->pTerSimData);
        p->pTerSimData = (uint *)0x0;
      }
      if (p->pFastSim != (int *)0x0) {
        free(p->pFastSim);
        p->pFastSim = (int *)0x0;
      }
      if (p->pData != (void *)0x0) {
        free(p->pData);
        p->pData = (void *)0x0;
      }
      if (p->pSeqModel != (Abc_Cex_t *)0x0) {
        free(p->pSeqModel);
        p->pSeqModel = (Abc_Cex_t *)0x0;
      }
      if (p->pName != (char *)0x0) {
        free(p->pName);
        p->pName = (char *)0x0;
      }
      if (p->pSpec != (char *)0x0) {
        free(p->pSpec);
        p->pSpec = (char *)0x0;
      }
      if (p->pObjCopies != (Aig_Obj_t **)0x0) {
        free(p->pObjCopies);
        p->pObjCopies = (Aig_Obj_t **)0x0;
      }
      if (p->pReprs != (Aig_Obj_t **)0x0) {
        free(p->pReprs);
        p->pReprs = (Aig_Obj_t **)0x0;
      }
      if (p->pEquivs != (Aig_Obj_t **)0x0) {
        free(p->pEquivs);
        p->pEquivs = (Aig_Obj_t **)0x0;
      }
      free(p->pTable);
      free(p);
      return;
    }
    pvVar2 = Vec_PtrEntry(pVVar1,iVar3);
    if ((pvVar2 != (void *)0x0) && ((*(byte *)((long)pvVar2 + 0x18) & 0x30) != 0)) break;
    iVar3 = iVar3 + 1;
  }
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigMan.c"
                ,0xc3,"void Aig_ManStop(Aig_Man_t *)");
}

Assistant:

void Aig_ManStop( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
    // make sure the nodes have clean marks
    Aig_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    if ( p->pFanData ) 
        Aig_ManFanoutStop( p );
    if ( p->pManExdc )  
        Aig_ManStop( p->pManExdc );
//    Aig_TableProfile( p );
    Aig_MmFixedStop( p->pMemObjs, 0 );
    Vec_PtrFreeP( &p->vCis );
    Vec_PtrFreeP( &p->vCos );
    Vec_PtrFreeP( &p->vObjs );
    Vec_PtrFreeP( &p->vBufs );
    //--jlong -- begin
    Vec_PtrFreeP( &p->unfold2_type_I );
    Vec_PtrFreeP( &p->unfold2_type_II );
    //--jlong -- end
    Vec_IntFreeP( &p->vLevelR );
    Vec_VecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vFlopNums );
    Vec_IntFreeP( &p->vFlopReprs );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vOnehots );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vProbs );
    Vec_IntFreeP( &p->vCiNumsOrig );
    Vec_PtrFreeP( &p->vMapped );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    ABC_FREE( p->pTerSimData );
    ABC_FREE( p->pFastSim );
    ABC_FREE( p->pData );
    ABC_FREE( p->pSeqModel );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pObjCopies );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pEquivs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}